

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  Cookie *pCVar11;
  char *pcVar12;
  char *__s;
  char *pcVar13;
  size_t sVar14;
  undefined8 *__base;
  Cookie *pCVar15;
  Cookie *pCVar16;
  size_t __nmemb;
  
  sVar9 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar9] != (Cookie *)0x0)) {
    remove_expired(c);
    _Var5 = Curl_host_is_ipnum(host);
    pCVar16 = c->cookies[sVar9];
    if (pCVar16 != (Cookie *)0x0) {
      __nmemb = 0;
      pCVar15 = (Cookie *)0x0;
      do {
        pCVar11 = pCVar15;
        if ((byte)(pCVar16->secure ^ 1U | secure) != 1) goto LAB_00526175;
        if (pCVar16->domain != (char *)0x0) {
          bVar6 = pCVar16->tailmatch ^ 1;
          if ((bVar6 & 1) == 0 && !_Var5) {
            _Var7 = tailmatch(pCVar16->domain,host);
            if (_Var7) goto LAB_00525f9e;
            bVar6 = pCVar16->tailmatch ^ 1;
          }
          if (((bVar6 & 1) == 0 && !_Var5) ||
             (iVar8 = Curl_strcasecompare(host,pCVar16->domain), iVar8 == 0)) goto LAB_00526175;
        }
LAB_00525f9e:
        pcVar12 = pCVar16->spath;
        if ((pcVar12 == (char *)0x0) || (sVar10 = strlen(pcVar12), sVar10 == 1)) goto LAB_00525fb9;
        __s = (*Curl_cstrdup)(path);
        if (__s != (char *)0x0) {
          pcVar13 = strchr(__s,0x3f);
          if (pcVar13 != (char *)0x0) {
            *pcVar13 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (*Curl_cstrdup)("/");
            if (__s == (char *)0x0) goto LAB_00526175;
          }
          sVar14 = strlen(__s);
          if ((sVar14 < sVar10) || (iVar8 = strncmp(pcVar12,__s,sVar10), iVar8 != 0)) {
            (*Curl_cfree)(__s);
          }
          else {
            if (sVar10 == sVar14) {
              (*Curl_cfree)(__s);
            }
            else {
              cVar1 = __s[sVar10];
              (*Curl_cfree)(__s);
              if (cVar1 != '/') goto LAB_00526175;
            }
LAB_00525fb9:
            pCVar11 = (Cookie *)(*Curl_ccalloc)(0x60,1);
            if (pCVar11 == (Cookie *)0x0) goto joined_r0x00526278;
            if (pCVar16->expirestr != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->expirestr);
              pCVar11->expirestr = pcVar12;
              if (pcVar12 != (char *)0x0) goto LAB_00525ff9;
LAB_005261c1:
              freecookie(pCVar11);
              goto joined_r0x00526278;
            }
LAB_00525ff9:
            if (pCVar16->domain != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->domain);
              pCVar11->domain = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->path != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->path);
              pCVar11->path = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->spath != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->spath);
              pCVar11->spath = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->name != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->name);
              pCVar11->name = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->value != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->value);
              pCVar11->value = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->maxage != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->maxage);
              pCVar11->maxage = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            if (pCVar16->version != (char *)0x0) {
              pcVar12 = (*Curl_cstrdup)(pCVar16->version);
              pCVar11->version = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_005261c1;
            }
            pCVar11->expires = pCVar16->expires;
            _Var7 = pCVar16->secure;
            _Var3 = pCVar16->livecookie;
            _Var4 = pCVar16->httponly;
            pCVar11->tailmatch = pCVar16->tailmatch;
            pCVar11->secure = _Var7;
            pCVar11->livecookie = _Var3;
            pCVar11->httponly = _Var4;
            pCVar11->creationtime = pCVar16->creationtime;
            pCVar11->next = pCVar15;
            __nmemb = __nmemb + 1;
            if (0x95 < __nmemb) {
              Curl_infof(data,"Included max number of cookies (%zu) in request!",__nmemb);
              goto LAB_005261f1;
            }
          }
        }
LAB_00526175:
        pCVar16 = pCVar16->next;
        pCVar15 = pCVar11;
      } while (pCVar16 != (Cookie *)0x0);
      if (__nmemb == 0) {
        return pCVar11;
      }
LAB_005261f1:
      __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
      pCVar15 = pCVar11;
      puVar2 = __base;
      if (__base != (undefined8 *)0x0) {
        for (; pCVar11 != (Cookie *)0x0; pCVar11 = pCVar11->next) {
          *puVar2 = pCVar11;
          puVar2 = puVar2 + 1;
        }
        qsort(__base,__nmemb,8,cookie_sort);
        pCVar16 = (Cookie *)*__base;
        if (__nmemb != 1) {
          sVar10 = 1;
          pCVar15 = pCVar16;
          do {
            pCVar11 = (Cookie *)__base[sVar10];
            pCVar15->next = pCVar11;
            sVar10 = sVar10 + 1;
            pCVar15 = pCVar11;
          } while (__nmemb != sVar10);
        }
        *(undefined8 *)__base[__nmemb - 1] = 0;
        (*Curl_cfree)(__base);
        return pCVar16;
      }
joined_r0x00526278:
      while (pCVar15 != (Cookie *)0x0) {
        pCVar16 = pCVar15->next;
        freecookie(pCVar15);
        pCVar15 = pCVar16;
      }
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}